

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O3

float Vec_StrGetF(Vec_Str_t *vOut,int *pPos)

{
  char cVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  
  uVar4 = *pPos;
  uVar6 = (ulong)uVar4;
  uVar7 = uVar4 + 1;
  *pPos = uVar7;
  if ((-1 < (int)uVar4) && ((int)uVar4 < vOut->nSize)) {
    pcVar5 = vOut->pArray;
    cVar1 = pcVar5[uVar6];
    iVar9 = (int)(uVar6 + 2);
    *pPos = iVar9;
    if ((int)uVar7 < vOut->nSize) {
      cVar2 = pcVar5[uVar7];
      iVar8 = (int)(uVar6 + 3);
      *pPos = iVar8;
      if (iVar9 < vOut->nSize) {
        cVar3 = pcVar5[uVar6 + 2];
        *pPos = uVar4 + 4;
        if (iVar8 < vOut->nSize) {
          return (float)CONCAT13(pcVar5[uVar6 + 3],CONCAT12(cVar3,CONCAT11(cVar2,cVar1)));
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline float Vec_StrGetF( Vec_Str_t * vOut, int * pPos )
{
    union { float num; unsigned char data[4]; } tmp;
    tmp.data[0] = Vec_StrEntry( vOut, (*pPos)++ );
    tmp.data[1] = Vec_StrEntry( vOut, (*pPos)++ );
    tmp.data[2] = Vec_StrEntry( vOut, (*pPos)++ );
    tmp.data[3] = Vec_StrEntry( vOut, (*pPos)++ );
    return tmp.num;
}